

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall slang::parsing::Parser::parseGenerateBlock(Parser *this)

{
  SyntaxNode *pSVar1;
  NamedLabelSyntax *label;
  NamedBlockClauseSyntax *beginName;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Diagnostic *this_00;
  SourceLocation SVar5;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  GenerateBlockSyntax *pGVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token colon;
  Token begin;
  bool anyLocalModules;
  MemberSyntax *member;
  Token end;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  bool local_109;
  NamedLabelSyntax *local_108;
  MemberSyntax *local_100;
  NamedBlockClauseSyntax *local_f8;
  Info *local_f0;
  undefined8 local_e8;
  Token *local_e0;
  Token *local_d8;
  Token local_d0;
  TokenList local_c0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_88;
  
  bVar2 = ParserBase::peek(&this->super_ParserBase,BeginKeyword);
  if (bVar2) {
    local_108 = (NamedLabelSyntax *)0x0;
  }
  else {
    bVar2 = ParserBase::peek(&this->super_ParserBase,Identifier);
    if (((!bVar2) || (TVar9 = ParserBase::peek(&this->super_ParserBase,1), TVar9.kind != Colon)) ||
       (TVar9 = ParserBase::peek(&this->super_ParserBase,2), TVar9.kind != BeginKeyword)) {
      pGVar6 = (GenerateBlockSyntax *)parseSingleMember(this,GenerateBlock);
      if (pGVar6 != (GenerateBlockSyntax *)0x0) {
        return &pGVar6->super_MemberSyntax;
      }
      local_88.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
      SVar5 = Token::location((Token *)&local_88);
      bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
      if (!bVar2) {
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x450005,SVar5);
      }
      local_88.super_SyntaxListBase.super_SyntaxNode.kind = 1;
      local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_88.super_SyntaxListBase.childCount = 0;
      local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
      local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 2;
      local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_c0.super_SyntaxListBase.childCount = 0;
      local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr = (pointer)0x0;
      local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent._M_extent_value =
           0;
      local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c94ef0;
      TVar9 = ParserBase::missingToken(&this->super_ParserBase,Semicolon,SVar5);
      pGVar6 = (GenerateBlockSyntax *)
               slang::syntax::SyntaxFactory::emptyMember(&this->factory,&local_88,&local_c0,TVar9);
      return &pGVar6->super_MemberSyntax;
    }
    TVar9 = ParserBase::consume(&this->super_ParserBase);
    colon = ParserBase::consume(&this->super_ParserBase);
    local_108 = slang::syntax::SyntaxFactory::namedLabel(&this->factory,TVar9,colon);
  }
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar9.info;
  local_e8 = TVar9._0_8_;
  local_f8 = parseNamedBlockClause(this);
  Token::Token(&local_d0);
  local_88.super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)((long)&local_88 + 0x18);
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_109 = false;
  local_d8 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_e0 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar2 = false;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0x8e)) break;
    local_100 = parseMember(this,GenerateBlock,&local_109);
    bVar8 = local_100 == (MemberSyntax *)0x0;
    if (bVar8) {
      bVar3 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar3) {
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        range = Token::range((Token *)&local_c0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_c0.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText((Token *)&local_c0);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           (bVar7 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar5 = Token::location(local_d8);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar5);
          SVar5 = Token::location(local_e0);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar5);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar2 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
      bVar2 = bVar8;
    }
    else {
      checkMemberAllowed(this,&local_100->super_SyntaxNode,GenerateBlock);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_88,&local_100);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_100->super_SyntaxNode).previewNode = pSVar1;
      bVar2 = bVar8;
    }
  }
  if (local_109 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  local_d0 = ParserBase::expect(&this->super_ParserBase,EndKeyword);
  iVar4 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_d0.info);
  if ((pointer)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      (pointer)((long)&local_88 + 0x18U)) {
    operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  endBlock = parseNamedBlockClause(this);
  beginName = local_f8;
  label = local_108;
  checkBlockNames(this,local_f8,endBlock,local_108);
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.childCount = 0;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)0x0;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = 0;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c8c880;
  local_c0.super_SyntaxListBase.super_SyntaxNode.kind = 1;
  local_c0.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_c0.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00c94a68;
  begin.info = local_f0;
  begin.kind = (undefined2)local_e8;
  begin._2_1_ = local_e8._2_1_;
  begin.numFlags.raw = local_e8._3_1_;
  begin.rawLen = local_e8._4_4_;
  local_c0.super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar4);
  pGVar6 = slang::syntax::SyntaxFactory::generateBlock
                     (&this->factory,&local_88,label,begin,beginName,
                      (SyntaxList<slang::syntax::MemberSyntax> *)&local_c0,local_d0,endBlock);
  return &pGVar6->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseGenerateBlock() {
    NamedLabelSyntax* label = nullptr;
    if (!peek(TokenKind::BeginKeyword)) {
        if (!peek(TokenKind::Identifier) || peek(1).kind != TokenKind::Colon ||
            peek(2).kind != TokenKind::BeginKeyword) {
            // This is just a single member instead of a block.
            auto member = parseSingleMember(SyntaxKind::GenerateBlock);
            if (member)
                return *member;

            // If there was some syntax error that caused parseMember to return null, fabricate an
            // empty member here and let our caller sort it out.
            auto loc = peek().location();
            if (!haveDiagAtCurrentLoc())
                addDiag(diag::ExpectedMember, loc);
            return factory.emptyMember(nullptr, nullptr, missingToken(TokenKind::Semicolon, loc));
        }

        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto begin = consume();
    auto beginName = parseNamedBlockClause();

    Token end;
    auto members =
        parseMemberList<MemberSyntax>(TokenKind::EndKeyword, end, SyntaxKind::GenerateBlock,
                                      [this](SyntaxKind parentKind, bool& anyLocalModules) {
                                          return parseMember(parentKind, anyLocalModules);
                                      });

    auto endName = parseNamedBlockClause();
    checkBlockNames(beginName, endName, label);

    return factory.generateBlock(nullptr, // never any attributes
                                 label, begin, beginName, members, end, endName);
}